

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall kj::(anonymous_namespace)::InMemoryFile::~InMemoryFile(InMemoryFile *this)

{
  anon_unknown_59::InMemoryFile::~InMemoryFile((InMemoryFile *)(this + -8));
  return;
}

Assistant:

InMemoryFile(const Clock& clock): impl(clock) {}